

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O0

bool cmTargetPropertyComputer::WhiteListedInterfaceProperty(string *prop)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar4;
  allocator local_1d1;
  value_type local_1d0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1b0;
  undefined1 local_1a8;
  allocator local_199;
  value_type local_198;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_178;
  undefined1 local_170;
  allocator local_161;
  value_type local_160;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_140;
  undefined1 local_138;
  allocator local_129;
  value_type local_128;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_108;
  undefined1 local_100;
  allocator local_f1;
  value_type local_f0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_d0;
  undefined1 local_c8;
  allocator local_b9;
  value_type local_b8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_98;
  undefined1 local_90;
  allocator local_81;
  value_type local_80;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_60;
  undefined1 local_58;
  allocator local_39;
  value_type local_38;
  string *local_18;
  string *prop_local;
  
  local_18 = prop;
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,11ul>(prop,(char (*) [11])0xa049bd);
  if (bVar1) {
    prop_local._7_1_ = true;
  }
  else {
    if ((WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                                     builtIns_abi_cxx11_), iVar2 != 0)) {
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                       builtIns_abi_cxx11_);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                           builtIns_abi_cxx11_);
    }
    bVar1 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_)
    ;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_38,"COMPATIBLE_INTERFACE_BOOL",&local_39);
      pVar4 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                        builtIns_abi_cxx11_,&local_38);
      local_60._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_58 = pVar4.second;
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"COMPATIBLE_INTERFACE_NUMBER_MAX",&local_81);
      pVar4 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                        builtIns_abi_cxx11_,&local_80);
      local_98._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_90 = pVar4.second;
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,"COMPATIBLE_INTERFACE_NUMBER_MIN",&local_b9);
      pVar4 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                        builtIns_abi_cxx11_,&local_b8);
      local_d0._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_c8 = pVar4.second;
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f0,"COMPATIBLE_INTERFACE_STRING",&local_f1);
      pVar4 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                        builtIns_abi_cxx11_,&local_f0);
      local_108._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_100 = pVar4.second;
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_128,"EXPORT_NAME",&local_129);
      pVar4 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                        builtIns_abi_cxx11_,&local_128);
      local_140._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_138 = pVar4.second;
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_160,"IMPORTED",&local_161);
      pVar4 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                        builtIns_abi_cxx11_,&local_160);
      local_178._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_170 = pVar4.second;
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,"NAME",&local_199);
      pVar4 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                        builtIns_abi_cxx11_,&local_198);
      local_1b0._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_1a8 = pVar4.second;
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d0,"TYPE",&local_1d1);
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_,
               &local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    }
    sVar3 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_,
                    local_18);
    if (sVar3 == 0) {
      bVar1 = std::operator==(local_18,"IMPORTED_CONFIGURATIONS");
      if ((((bVar1) || (bVar1 = std::operator==(local_18,"IMPORTED_LIBNAME"), bVar1)) ||
          (bVar1 = std::operator==(local_18,"NO_SYSTEM_FROM_IMPORTED"), bVar1)) ||
         ((bVar1 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                             (local_18,(char (*) [18])"IMPORTED_LIBNAME_"), bVar1 ||
          (bVar1 = cmHasLiteralPrefix<std::__cxx11::string,21ul>
                             (local_18,(char (*) [21])"MAP_IMPORTED_CONFIG_"), bVar1)))) {
        prop_local._7_1_ = true;
      }
      else {
        prop_local._7_1_ = false;
      }
    }
    else {
      prop_local._7_1_ = true;
    }
  }
  return prop_local._7_1_;
}

Assistant:

bool cmTargetPropertyComputer::WhiteListedInterfaceProperty(
  const std::string& prop)
{
  if (cmHasLiteralPrefix(prop, "INTERFACE_")) {
    return true;
  }
  static CM_UNORDERED_SET<std::string> builtIns;
  if (builtIns.empty()) {
    builtIns.insert("COMPATIBLE_INTERFACE_BOOL");
    builtIns.insert("COMPATIBLE_INTERFACE_NUMBER_MAX");
    builtIns.insert("COMPATIBLE_INTERFACE_NUMBER_MIN");
    builtIns.insert("COMPATIBLE_INTERFACE_STRING");
    builtIns.insert("EXPORT_NAME");
    builtIns.insert("IMPORTED");
    builtIns.insert("NAME");
    builtIns.insert("TYPE");
  }

  if (builtIns.count(prop)) {
    return true;
  }

  if (prop == "IMPORTED_CONFIGURATIONS" || prop == "IMPORTED_LIBNAME" ||
      prop == "NO_SYSTEM_FROM_IMPORTED" ||
      cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME_") ||
      cmHasLiteralPrefix(prop, "MAP_IMPORTED_CONFIG_")) {
    return true;
  }

  return false;
}